

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

TypeArray * __thiscall
soul::AST::Function::getParameterTypes(TypeArray *__return_storage_ptr__,Function *this)

{
  bool bVar1;
  size_type minSize;
  VariableDeclaration *this_00;
  Type local_68;
  reference local_50;
  pool_ref<soul::AST::VariableDeclaration> *param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2;
  Function *this_local;
  TypeArray *types;
  
  ArrayWithPreallocation<soul::Type,_8UL>::ArrayWithPreallocation(__return_storage_ptr__);
  minSize = std::
            vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
            ::size(&this->parameters);
  ArrayWithPreallocation<soul::Type,_8UL>::reserve(__return_storage_ptr__,minSize);
  __end2 = std::
           vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ::begin(&this->parameters);
  param = (pool_ref<soul::AST::VariableDeclaration> *)
          std::
          vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
          ::end(&this->parameters);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                                     *)&param), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
               ::operator*(&__end2);
    this_00 = pool_ref<soul::AST::VariableDeclaration>::operator->(local_50);
    VariableDeclaration::getType(&local_68,this_00);
    ArrayWithPreallocation<soul::Type,_8UL>::push_back(__return_storage_ptr__,&local_68);
    Type::~Type(&local_68);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

TypeArray getParameterTypes() const
        {
            TypeArray types;
            types.reserve (parameters.size());

            for (auto& param : parameters)
                types.push_back (param->getType());

            return types;
        }